

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcArithmeticCodec.cpp
# Opt level: O3

uint __thiscall o3dgc::Arithmetic_Codec::decode(Arithmetic_Codec *this,Static_Data_Model *M)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  byte *pbVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  bool bVar12;
  
  uVar10 = this->length;
  if (M->decoder_table == (uint *)0x0) {
    uVar9 = uVar10 >> 0xf;
    this->length = uVar9;
    uVar6 = M->data_symbols;
    uVar11 = uVar6 >> 1;
    uVar8 = this->value;
    uVar4 = 0;
    uVar3 = 0;
    do {
      uVar7 = M->distribution[uVar11] * uVar9;
      uVar2 = uVar11;
      if (uVar7 <= uVar8) {
        uVar2 = uVar6;
        uVar4 = uVar7;
        uVar7 = uVar10;
        uVar3 = uVar11;
      }
      uVar10 = uVar7;
      uVar6 = uVar2;
      uVar11 = uVar3 + uVar6 >> 1;
    } while (uVar11 != uVar3);
  }
  else {
    uVar8 = this->value;
    uVar9 = uVar10 >> 0xf;
    this->length = uVar9;
    uVar6 = uVar8 / uVar9 >> ((byte)M->table_shift & 0x1f);
    puVar1 = M->distribution;
    uVar3 = M->decoder_table[uVar6];
    uVar6 = M->decoder_table[uVar6 + 1] + 1;
    while (uVar4 = uVar6, uVar3 + 1 < uVar4) {
      uVar6 = uVar4 + uVar3 >> 1;
      if (puVar1[uVar6] <= uVar8 / uVar9) {
        uVar3 = uVar6;
        uVar6 = uVar4;
      }
    }
    uVar4 = puVar1[uVar3] * uVar9;
    if (uVar3 != M->last_symbol) {
      uVar10 = uVar9 * puVar1[uVar3 + 1];
    }
  }
  uVar8 = uVar8 - uVar4;
  this->value = uVar8;
  uVar10 = uVar10 - uVar4;
  this->length = uVar10;
  if (uVar10 < 0x1000000) {
    pbVar5 = this->ac_pointer;
    do {
      pbVar5 = pbVar5 + 1;
      this->ac_pointer = pbVar5;
      uVar8 = uVar8 << 8 | (uint)*pbVar5;
      this->value = uVar8;
      this->length = uVar10 << 8;
      bVar12 = uVar10 < 0x10000;
      uVar10 = uVar10 << 8;
    } while (bVar12);
  }
  return uVar3;
}

Assistant:

unsigned Arithmetic_Codec::decode(Static_Data_Model & M)
    {
    #ifdef _DEBUG
      if (mode != 2) AC_Error("decoder not initialized");
    #endif

      unsigned n, s, x, y = length;

      if (M.decoder_table) {              // use table look-up for faster decoding

        unsigned dv = value / (length >>= DM__LengthShift);
        unsigned t = dv >> M.table_shift;

        s = M.decoder_table[t];         // initial decision based on table look-up
        n = M.decoder_table[t+1] + 1;

        while (n > s + 1) {                        // finish with bisection search
          unsigned m = (s + n) >> 1;
          if (M.distribution[m] > dv) n = m; else s = m;
        }
                                                               // compute products
        x = M.distribution[s] * length;
        if (s != M.last_symbol) y = M.distribution[s+1] * length;
      }

      else {                                  // decode using only multiplications

        x = s = 0;
        length >>= DM__LengthShift;
        unsigned m = (n = M.data_symbols) >> 1;
                                                    // decode via bisection search
        do {
          unsigned z = length * M.distribution[m];
          if (z > value) {
            n = m;
            y = z;                                             // value is smaller
          }
          else {
            s = m;
            x = z;                                     // value is larger or equal
          }
        } while ((m = (s + n) >> 1) != s);
      }

      value -= x;                                               // update interval
      length = y - x;

      if (length < AC__MinLength) renorm_dec_interval();        // renormalization

      return s;
    }